

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_37(QPDF *pdf,char *arg2)

{
  QPDFPageObjectHelper *page;
  ParserCallbacks cb;
  ParserCallbacks *local_58;
  ParserCallbacks *local_50;
  undefined **local_40 [4];
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40);
  for (; local_58 != local_50; local_58 = local_58 + 0x38) {
    local_40[0] = &PTR__ParserCallbacks_00158728;
    QPDFPageObjectHelper::parseContents(local_58);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_58);
  return;
}

Assistant:

static void
test_37(QPDF& pdf, char const* arg2)
{
    // Parse content streams of all pages
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ParserCallbacks cb;
        page.parseContents(&cb);
    }
}